

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O1

void axl::io::createSockAddrNetMask_ip4(sockaddr_in *addr,size_t bitCount)

{
  size_t to;
  
  addr->sin_family = 0;
  addr->sin_port = 0;
  addr->sin_addr = 0;
  addr->sin_zero[0] = '\0';
  addr->sin_zero[1] = '\0';
  addr->sin_zero[2] = '\0';
  addr->sin_zero[3] = '\0';
  addr->sin_zero[4] = '\0';
  addr->sin_zero[5] = '\0';
  addr->sin_zero[6] = '\0';
  addr->sin_zero[7] = '\0';
  addr->sin_family = 2;
  to = 0x20;
  if (bitCount < 0x20) {
    to = bitCount;
  }
  sl::setBitRange((size_t *)&addr->sin_addr,1,0,to);
  return;
}

Assistant:

void
createSockAddrNetMask_ip4(
	sockaddr_in* addr,
	size_t bitCount
) {
	memset(addr, 0, sizeof(sockaddr_in));
	addr->sin_family = AF_INET;

	size_t maxBitCount = sizeof(addr->sin_addr) * 8;
	if (bitCount > maxBitCount)
		bitCount = maxBitCount;

	sl::setBitRange((size_t*)&addr->sin_addr, 1, 0, bitCount);
}